

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_format.cc
# Opt level: O0

lts_20240722 *
absl::lts_20240722::log_internal::FormatLogMessage_abi_cxx11_
          (LogSeverity severity,CivilSecond civil_second,Duration subsecond,Tid tid,
          string_view basename,int line,PrefixFormat format,string_view message)

{
  Duration DVar1;
  char *args;
  undefined4 in_register_0000003c;
  char *local_c0;
  HiRep local_b4;
  uint32_t local_ac;
  HiRep local_a4;
  uint32_t local_9c;
  long local_98;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)131067,_(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)524292,_(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)262148,_(absl::lts_20240722::FormatConversionCharSet)524292>
  local_78;
  LogSeverity local_68;
  HiRep HStack_64;
  LogSeverity severity_local;
  Tid local_5c;
  HiRep local_54;
  Duration subsecond_local;
  CivilSecond civil_second_local;
  
  HStack_64.hi_ = (uint32_t)((ulong)register0x00000080 >> 0x20);
  HStack_64.lo_ = subsecond.rep_lo_;
  subsecond_local._4_8_ = civil_second.f_._8_8_;
  local_68 = (LogSeverity)civil_second.f_.y;
  local_5c = tid;
  local_54 = HStack_64;
  subsecond_local.rep_hi_.lo_ = tid;
  str_format_internal::
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)131067,_(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)524292,_(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)262148,_(absl::lts_20240722::FormatConversionCharSet)524292>
  ::FormatSpecTemplate(&local_78,"%c%02d%02d %02d:%02d:%02d.%06d %7d %s:%d] %s%s");
  args = LogSeverityName(local_68);
  local_7c = time_internal::cctz::detail::civil_time<absl::lts_20240722::time_internal::second_tag>
             ::month((civil_time<absl::lts_20240722::time_internal::second_tag> *)
                     &subsecond_local.rep_hi_.hi_);
  local_80 = time_internal::cctz::detail::civil_time<absl::lts_20240722::time_internal::second_tag>
             ::day((civil_time<absl::lts_20240722::time_internal::second_tag> *)
                   &subsecond_local.rep_hi_.hi_);
  local_84 = time_internal::cctz::detail::civil_time<absl::lts_20240722::time_internal::second_tag>
             ::hour((civil_time<absl::lts_20240722::time_internal::second_tag> *)
                    &subsecond_local.rep_hi_.hi_);
  local_88 = time_internal::cctz::detail::civil_time<absl::lts_20240722::time_internal::second_tag>
             ::minute((civil_time<absl::lts_20240722::time_internal::second_tag> *)
                      &subsecond_local.rep_hi_.hi_);
  local_8c = time_internal::cctz::detail::civil_time<absl::lts_20240722::time_internal::second_tag>
             ::second((civil_time<absl::lts_20240722::time_internal::second_tag> *)
                      &subsecond_local.rep_hi_.hi_);
  local_a4 = local_54;
  local_9c = subsecond_local.rep_hi_.lo_;
  local_b4 = local_54;
  local_ac = subsecond_local.rep_hi_.lo_;
  DVar1.rep_lo_ = subsecond_local.rep_hi_.lo_;
  DVar1.rep_hi_ = local_54;
  local_98 = absl::lts_20240722::ToInt64Microseconds(DVar1);
  local_c0 = "";
  if ((int)message._M_len == 1) {
    local_c0 = "RAW: ";
  }
  StrFormat<char,_int,_int,_int,_int,_int,_long,_int,_std::basic_string_view<char,_std::char_traits<char>_>,_int,_const_char_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
            ((lts_20240722 *)CONCAT44(in_register_0000003c,severity),&local_78,args,&local_7c,
             &local_80,&local_84,&local_88,&local_8c,&local_98,(int *)&basename,
             (basic_string_view<char,_std::char_traits<char>_> *)&basename._M_str,(int *)&format,
             &local_c0,(basic_string_view<char,_std::char_traits<char>_> *)&message._M_str);
  return (lts_20240722 *)CONCAT44(in_register_0000003c,severity);
}

Assistant:

std::string FormatLogMessage(absl::LogSeverity severity,
                             absl::CivilSecond civil_second,
                             absl::Duration subsecond, log_internal::Tid tid,
                             absl::string_view basename, int line,
                             PrefixFormat format, absl::string_view message) {
  return absl::StrFormat(
      "%c%02d%02d %02d:%02d:%02d.%06d %7d %s:%d] %s%s",
      absl::LogSeverityName(severity)[0], civil_second.month(),
      civil_second.day(), civil_second.hour(), civil_second.minute(),
      civil_second.second(), absl::ToInt64Microseconds(subsecond), tid,
      basename, line, format == PrefixFormat::kRaw ? "RAW: " : "", message);
}